

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::AudioTrack::AudioTrack(AudioTrack *this,uint *seed)

{
  Track *in_RSI;
  uint *in_RDI;
  
  Track::Track(in_RSI,in_RDI);
  *(undefined ***)in_RDI = &PTR__AudioTrack_00c95778;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  in_RDI[0x20] = 1;
  in_RDI[0x21] = 0;
  in_RDI[0x22] = 0;
  in_RDI[0x23] = 0;
  return;
}

Assistant:

AudioTrack::AudioTrack(unsigned int* seed)
    : Track(seed), bit_depth_(0), channels_(1), sample_rate_(0.0) {}